

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O3

void __thiscall Potassco::AspifInput::matchString(AspifInput *this)

{
  uint uVar1;
  uint uVar2;
  BufferedStream *pBVar3;
  EVP_PKEY_CTX *dst;
  
  uVar1 = ProgramReader::matchPos
                    (&this->super_ProgramReader,0xffffffff,"non-negative string length expected");
  pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
  BufferedStream::get(pBVar3);
  dst = (EVP_PKEY_CTX *)0x0;
  std::__cxx11::string::resize((ulong)&this->data_->sym,(char)uVar1);
  pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
  if (uVar1 != 0) {
    dst = (EVP_PKEY_CTX *)(this->data_->sym)._M_dataplus._M_p;
  }
  uVar2 = BufferedStream::copy(pBVar3,dst,(EVP_PKEY_CTX *)(ulong)uVar1);
  ProgramReader::require(&this->super_ProgramReader,uVar2 == uVar1,"invalid string");
  return;
}

Assistant:

void AspifInput::matchString() {
	uint32_t len = matchPos("non-negative string length expected");
	stream()->get();
	data_->sym.resize(len);
	require(stream()->copy(len ? &data_->sym[0] : static_cast<char*>(0), (int)len) == (int)len, "invalid string");
}